

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O3

void de::anon_unknown_0::multiThreadRemoveTest(int numThreads,WaitMode waitMode)

{
  ulong __n;
  long *plVar1;
  ulong uVar2;
  void *__s;
  Thread *this;
  ulong uVar3;
  SpinBarrier barrier;
  deUint32 local_44;
  int local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  uVar2 = (ulong)(uint)numThreads;
  local_44 = deGetNumAvailableLogicalCores();
  local_3c = 0;
  local_38 = 0;
  local_34 = 0;
  __n = uVar2 * 8;
  local_40 = numThreads;
  __s = operator_new(__n);
  if (numThreads != 0) {
    memset(__s,0,__n);
    if (0 < numThreads) {
      uVar3 = 0;
      do {
        this = (Thread *)operator_new(0x30);
        Thread::Thread(this);
        this->_vptr_Thread = (_func_int **)&PTR__Thread_00d1cbc8;
        this[1]._vptr_Thread = (_func_int **)&local_44;
        this[1].m_attribs.priority = numThreads;
        *(int *)&this[1].field_0xc = (int)uVar3;
        *(WaitMode *)&this[1].m_thread = waitMode;
        *(Thread **)((long)__s + uVar3 * 8) = this;
        Thread::start(this);
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      if (0 < numThreads) {
        uVar3 = 0;
        do {
          Thread::join(*(Thread **)((long)__s + uVar3 * 8));
          plVar1 = *(long **)((long)__s + uVar3 * 8);
          if (plVar1 != (long *)0x0) {
            (**(code **)(*plVar1 + 8))();
          }
          uVar3 = uVar3 + 1;
        } while (uVar2 != uVar3);
      }
    }
  }
  operator_delete(__s,__n);
  return;
}

Assistant:

void multiThreadRemoveTest (int numThreads, SpinBarrier::WaitMode waitMode)
{
	SpinBarrier						barrier		(numThreads);
	std::vector<TestExitThread*>	threads		(numThreads, static_cast<TestExitThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestExitThread(barrier, numThreads, ndx, waitMode);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}
}